

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

UChar * ures_getNextString_63(UResourceBundle *resB,int32_t *len,char **key,UErrorCode *status)

{
  uint array;
  UChar *pUVar1;
  int32_t indexR;
  
  if (status == (UErrorCode *)0x0) {
    return (UChar *)0x0;
  }
  if (U_ZERO_ERROR < *status) {
    return (UChar *)0x0;
  }
  if (resB == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return (UChar *)0x0;
  }
  if (resB->fIndex == resB->fSize + -1) {
    *status = U_INDEX_OUTOFBOUNDS_ERROR;
    return (UChar *)0x0;
  }
  indexR = resB->fIndex + 1;
  resB->fIndex = indexR;
  array = resB->fRes;
  switch(array >> 0x1c) {
  case 0:
  case 6:
    pUVar1 = res_getString_63(&resB->fResData,array,len);
    return pUVar1;
  case 1:
  case 7:
  case 0xe:
    *status = U_RESOURCE_TYPE_MISMATCH;
    return (UChar *)0x0;
  case 2:
  case 4:
  case 5:
    array = res_getTableItemByIndex_63(&resB->fResData,array,indexR,key);
    break;
  case 3:
    goto LAB_002f7585;
  case 8:
  case 9:
    array = res_getArrayItem_63(&resB->fResData,array,indexR);
    break;
  default:
    return (UChar *)0x0;
  }
  indexR = resB->fIndex;
LAB_002f7585:
  pUVar1 = ures_getStringWithAlias(resB,array,indexR,len,status);
  return pUVar1;
}

Assistant:

U_CAPI const UChar* U_EXPORT2 ures_getNextString(UResourceBundle *resB, int32_t* len, const char ** key, UErrorCode *status) {
  Resource r = RES_BOGUS;
  
  if (status==NULL || U_FAILURE(*status)) {
    return NULL;
  }
  if(resB == NULL) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return NULL;
  }
  
  if(resB->fIndex == resB->fSize-1) {
    *status = U_INDEX_OUTOFBOUNDS_ERROR;
  } else {
    resB->fIndex++;
    switch(RES_GET_TYPE(resB->fRes)) {
    case URES_STRING:
    case URES_STRING_V2:
      return res_getString(&(resB->fResData), resB->fRes, len); 
    case URES_TABLE:
    case URES_TABLE16:
    case URES_TABLE32:
      r = res_getTableItemByIndex(&(resB->fResData), resB->fRes, resB->fIndex, key);
      if(r == RES_BOGUS && resB->fHasFallback) {
        /* TODO: do the fallback */
      }
      return ures_getStringWithAlias(resB, r, resB->fIndex, len, status);
    case URES_ARRAY:
    case URES_ARRAY16:
      r = res_getArrayItem(&(resB->fResData), resB->fRes, resB->fIndex);
      if(r == RES_BOGUS && resB->fHasFallback) {
        /* TODO: do the fallback */
      }
      return ures_getStringWithAlias(resB, r, resB->fIndex, len, status);
    case URES_ALIAS:
      return ures_getStringWithAlias(resB, resB->fRes, resB->fIndex, len, status);
    case URES_INT:
    case URES_BINARY:
    case URES_INT_VECTOR:
        *status = U_RESOURCE_TYPE_MISMATCH;
        U_FALLTHROUGH;
    default:
      return NULL;
    }
  }

  return NULL;
}